

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::RegisterDataSourceRequest::Serialize
          (RegisterDataSourceRequest *this,Message *msg)

{
  bool bVar1;
  DataSourceDescriptor *this_00;
  Message *msg_00;
  void *data;
  size_t size;
  Message *msg_local;
  RegisterDataSourceRequest *this_local;
  
  bVar1 = std::bitset<2UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::operator*
                        (&this->data_source_descriptor_);
    msg_00 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    DataSourceDescriptor::Serialize(this_00,msg_00);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void RegisterDataSourceRequest::Serialize(::protozero::Message* msg) const {
  // Field 1: data_source_descriptor
  if (_has_field_[1]) {
    (*data_source_descriptor_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}